

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  const_iterator f;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region local_100;
  region local_b8;
  result<toml::detail::region,_toml::detail::none_t> local_70;
  
  f._M_current = (loc->iter_)._M_current;
  if (f._M_current ==
      (((loc->source_).
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'"'>,_toml::detail::character<'\\'>,_toml::detail::character<'\x7f'>_>
    ::invoke(&local_70,loc);
    if (local_70.is_ok_ == true) {
      location::reset(loc,f);
      __return_storage_ptr__->is_ok_ = false;
    }
    else {
      location::reset(loc,(const_iterator)(f._M_current + 1));
      region::region(&local_b8,loc,(const_iterator)f._M_current,
                     (const_iterator)(loc->iter_)._M_current);
      sVar6 = local_b8.source_name_._M_string_length;
      _Var5._M_pi = local_b8.source_.
                    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar4 = local_b8.source_.
               super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      paVar2 = &local_100.source_name_.field_2;
      local_100.super_region_base._vptr_region_base = (_func_int **)&PTR__region_001c9670;
      paVar3 = &local_b8.source_name_.field_2;
      local_b8.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_b8.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.source_name_._M_dataplus._M_p == paVar3) {
        local_100.source_name_.field_2._8_8_ = local_b8.source_name_.field_2._8_8_;
        local_100.source_name_._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_100.source_name_._M_dataplus._M_p = local_b8.source_name_._M_dataplus._M_p;
      }
      local_100.source_name_.field_2._M_allocated_capacity._1_7_ =
           local_b8.source_name_.field_2._M_allocated_capacity._1_7_;
      local_100.source_name_.field_2._M_local_buf[0] = local_b8.source_name_.field_2._M_local_buf[0]
      ;
      local_b8.source_name_._M_string_length = 0;
      local_b8.source_name_.field_2._M_local_buf[0] = '\0';
      local_100.first_._M_current = local_b8.first_._M_current;
      local_100.last_._M_current = local_b8.last_._M_current;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_001c9670;
      (__return_storage_ptr__->field_1).succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      (__return_storage_ptr__->field_1).succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_100.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->field_1).succ.value.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var5._M_pi;
      local_100.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.source_name_._M_dataplus._M_p == paVar2) {
        paVar1->_M_allocated_capacity = local_100.source_name_.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8) =
             local_100.source_name_.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
             local_100.source_name_._M_dataplus._M_p;
        (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
             local_100.source_name_.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar6;
      local_100.source_name_._M_string_length = 0;
      local_100.source_name_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_b8.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
      (__return_storage_ptr__->field_1).succ.value.first_._M_current = local_b8.first_._M_current;
      (__return_storage_ptr__->field_1).succ.value.last_._M_current = local_b8.last_._M_current;
      local_100.source_name_._M_dataplus._M_p = (pointer)paVar2;
      local_b8.source_name_._M_dataplus._M_p = (pointer)paVar3;
      region::~region(&local_100);
      region::~region(&local_b8);
    }
    if (local_70.is_ok_ == true) {
      region::~region(&local_70.field_1.succ.value);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        if(loc.iter() == loc.end()) {return none();}
        auto first = loc.iter();

        auto rslt = Combinator::invoke(loc);
        if(rslt.is_ok())
        {
            loc.reset(first);
            return none();
        }
        loc.reset(std::next(first)); // XXX maybe loc.advance() is okay but...
        return ok(region(loc, first, loc.iter()));
    }